

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O1

void __thiscall crnlib::semaphore::release(semaphore *this,long releaseCount)

{
  int iVar1;
  long lVar2;
  
  if (0 < releaseCount) {
    lVar2 = releaseCount + 1;
    do {
      iVar1 = sem_post((sem_t *)this->m_sem);
      if (iVar1 != 0) {
        crnlib_fail("\"semaphore: sem_post() or sem_post_multiple() failed\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DaemonEngine[P]crunch/crnlib/crn_threading_pthreads.cpp"
                    ,0x96);
        return;
      }
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
  }
  return;
}

Assistant:

void semaphore::release(long releaseCount) {
  CRNLIB_ASSERT(releaseCount >= 1);

  int status = 0;
#ifdef WIN32
  if (1 == releaseCount)
    status = sem_post(m_sem);
  else
    status = sem_post_multiple(m_sem, releaseCount);
#else
  while (releaseCount > 0) {
    status = sem_post(m_sem);
    if (status)
      break;
    releaseCount--;
  }
#endif

  if (status) {
    CRNLIB_FAIL("semaphore: sem_post() or sem_post_multiple() failed");
  }
}